

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

void __thiscall re2::Compiler::AddRuneRange(Compiler *this,Rune lo,Rune hi,bool foldcase)

{
  bool foldcase_local;
  Rune hi_local;
  Rune lo_local;
  Compiler *this_local;
  
  if ((this->encoding_ == kEncodingUTF8) || (this->encoding_ != kEncodingLatin1)) {
    AddRuneRangeUTF8(this,lo,hi,foldcase);
  }
  else {
    AddRuneRangeLatin1(this,lo,hi,foldcase);
  }
  return;
}

Assistant:

void Compiler::AddRuneRange(Rune lo, Rune hi, bool foldcase) {
  switch (encoding_) {
    default:
    case kEncodingUTF8:
      AddRuneRangeUTF8(lo, hi, foldcase);
      break;
    case kEncodingLatin1:
      AddRuneRangeLatin1(lo, hi, foldcase);
      break;
  }
}